

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FrexpCaseInstance::compare
          (FrexpCaseInstance *this,void **inputs,void **outputs)

{
  float a;
  ShaderType SVar1;
  int iVar2;
  pointer pSVar3;
  float fVar4;
  deUint32 dVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  ulong uVar9;
  ulong uVar10;
  deUint32 u32;
  float refOut0;
  uint local_50;
  int refOut1;
  FrexpCaseInstance *local_48;
  void **local_40;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (ulong)*(uint *)((long)&(pSVar3->varType).m_data + 4);
  local_40 = inputs;
  local_50 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  SVar1 = (this->super_CommonFunctionTestInstance).m_shaderType;
  uVar7 = ~(-1 << (0x17 - (&DAT_009f499c)[uVar8 * 4] & 0x1f));
  uVar9 = 0;
  uVar10 = 0;
  local_48 = this;
  if (0 < (int)local_50) {
    uVar10 = (ulong)local_50;
  }
  do {
    if (uVar10 == uVar9) {
LAB_007a4999:
      return (long)(int)local_50 <= (long)uVar9;
    }
    a = *(float *)((long)*outputs + uVar9 * 4);
    iVar2 = *(int *)((long)outputs[1] + uVar9 * 4);
    frexp((anon_unknown_0 *)&refOut0,(double)(ulong)*(uint *)((long)*local_40 + uVar9 * 4),&refOut1)
    ;
    fVar4 = refOut0;
    if (SVar1 == SHADERTYPE_FRAGMENT || uVar8 != 2) {
      dVar5 = getUlpDiffIgnoreZeroSign(a,refOut0);
    }
    else {
      dVar5 = (int)refOut0 - (int)a;
      if ((uint)refOut0 < (uint)a) {
        dVar5 = -((int)refOut0 - (int)a);
      }
    }
    if ((uVar7 < dVar5) || (iVar2 != refOut1)) {
      poVar6 = std::operator<<((ostream *)&(local_48->super_CommonFunctionTestInstance).m_failMsg,
                               "Expected [");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar9);
      poVar6 = std::operator<<(poVar6,"] = ");
      local_34.value = fVar4;
      poVar6 = anon_unknown_0::operator<<(poVar6,&local_34);
      poVar6 = std::operator<<(poVar6,", ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,refOut1);
      poVar6 = std::operator<<(poVar6," with ULP threshold ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar7;
      poVar6 = tcu::Format::operator<<(poVar6,hex);
      poVar6 = std::operator<<(poVar6,", got ULP diff ");
      hex_00.value._4_4_ = 0;
      hex_00.value._0_4_ = dVar5;
      tcu::Format::operator<<(poVar6,hex_00);
      goto LAB_007a4999;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type						= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision					= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize					= glu::getDataTypeScalarSize(type);
		const bool				transitSupportsSignedZero	= (m_shaderType != glu::SHADERTYPE_FRAGMENT); // executor cannot reliably transit negative zero to fragment stage
		const bool				signedZero					= supportsSignedZero(precision) && transitSupportsSignedZero;

		const int				mantissaBits				= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff					= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const int		out1		= ((const int*)outputs[1])[compNdx];

			float			refOut0;
			int				refOut1;

			frexp(in0, &refOut0, &refOut1);

			const deUint32	ulpDiff0	= signedZero ? getUlpDiff(out0, refOut0) : getUlpDiffIgnoreZeroSign(out0, refOut0);

			if (ulpDiff0 > maxUlpDiff || out1 != refOut1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", " << refOut1 << " with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff0);
				return false;
			}
		}

		return true;
	}